

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall
Importer_isResolvedUnitsChildUnresolved_Test::~Importer_isResolvedUnitsChildUnresolved_Test
          (Importer_isResolvedUnitsChildUnresolved_Test *this)

{
  Importer_isResolvedUnitsChildUnresolved_Test *this_local;
  
  ~Importer_isResolvedUnitsChildUnresolved_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, isResolvedUnitsChildUnresolved)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/importing_units_with_unresolved_children.cellml"));
    auto importer = libcellml::Importer::create();

    EXPECT_TRUE(model->hasUnresolvedImports());
    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_EQ(size_t(1), importer->libraryCount());
    EXPECT_EQ(resourcePath("importer/units_children.cellml"), importer->key(0));

    auto units1 = model->units(0);

    EXPECT_FALSE(units1->isResolved());

    EXPECT_TRUE(model->hasUnresolvedImports());
}